

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error __thiscall ald::imm_attr(ald *this,context *ctx,token *token,opcode *op)

{
  bool bVar1;
  int iVar2;
  token local_c0;
  byte local_92;
  byte local_91;
  token local_90;
  uint local_68;
  byte local_51;
  token local_50;
  opcode *local_28;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  error *tmpres___LINE__;
  
  local_28 = op;
  op_local = (opcode *)token;
  token_local = (token *)ctx;
  ctx_local = (context *)this;
  iVar2 = equal(token,"a");
  if (iVar2 == 0) {
    fail((token *)this,(char *)op_local,"expected \'a\'");
  }
  else {
    context::tokenize(&local_50,(context *)token_local);
    memcpy(op_local,&local_50,0x24);
    local_51 = 0;
    confirm_type((token *)this,(token_type)op_local);
    bVar1 = error::operator_cast_to_bool((error *)this);
    if (bVar1) {
      local_51 = 1;
    }
    local_68 = (uint)bVar1;
    if ((local_51 & 1) == 0) {
      error::~error((error *)this);
    }
    if (local_68 == 0) {
      context::tokenize(&local_90,(context *)token_local);
      memcpy(op_local,&local_90,0x24);
      local_91 = 0;
      uinteger<10,20>((context *)this,token_local,op_local);
      bVar1 = error::operator_cast_to_bool((error *)this);
      if (bVar1) {
        local_91 = 1;
      }
      local_68 = (uint)bVar1;
      if ((local_91 & 1) == 0) {
        error::~error((error *)this);
      }
      if (local_68 == 0) {
        opcode::add_bits(local_28,0xff00);
        local_92 = 0;
        confirm_type((token *)this,(token_type)op_local);
        bVar1 = error::operator_cast_to_bool((error *)this);
        if (bVar1) {
          local_92 = 1;
        }
        local_68 = (uint)bVar1;
        if ((local_92 & 1) == 0) {
          error::~error((error *)this);
        }
        if (local_68 == 0) {
          context::tokenize(&local_c0,(context *)token_local);
          memcpy(op_local,&local_c0,0x24);
          memset(this,0,8);
          error::error((error *)this);
        }
      }
    }
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(imm_attr)
    {
        if (!equal(token, "a")) {
            return fail(token, "expected 'a'");
        }
        token = ctx.tokenize();

        CHECK(confirm_type(token, token_type::bracket_left));
        token = ctx.tokenize();

        CHECK((uinteger<10, 20>(ctx, token, op)));
        op.add_bits(0xFFULL << 8);

        CHECK(confirm_type(token, token_type::bracket_right));
        token = ctx.tokenize();
        return {};
    }